

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int run_test_ipc_listen_after_write(void)

{
  undefined8 uVar1;
  char *pcVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  run_ipc_test("ipc_helper_listen_after_write",on_read);
  eval_b = (int64_t)local_conn_accepted;
  if (eval_b == 1) {
    eval_b = (int64_t)remote_conn_accepted;
    if (eval_b == 1) {
      eval_b = (int64_t)read_cb_called;
      if (eval_b == 1) {
        eval_b = (int64_t)exit_cb_called;
        if (eval_b == 1) {
          return 0;
        }
        pcVar2 = "exit_cb_called";
        uVar1 = 0x1c5;
      }
      else {
        pcVar2 = "read_cb_called";
        uVar1 = 0x1c4;
      }
    }
    else {
      pcVar2 = "remote_conn_accepted";
      uVar1 = 0x1c3;
    }
  }
  else {
    pcVar2 = "local_conn_accepted";
    uVar1 = 0x1c2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc.c"
          ,uVar1,"1","==",pcVar2,1,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(ipc_listen_after_write) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_listen_after_write", on_read);
  ASSERT_EQ(1, local_conn_accepted);
  ASSERT_EQ(1, remote_conn_accepted);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, exit_cb_called);
  return r;
}